

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O0

void fiat_p256_opp(uint64_t *out1,uint64_t *arg1)

{
  fiat_p256_uint1 local_99;
  uint64_t uStack_98;
  fiat_p256_uint1 x17;
  uint64_t x16;
  uint64_t uStack_88;
  fiat_p256_uint1 x15;
  uint64_t x14;
  uint64_t uStack_78;
  fiat_p256_uint1 x13;
  uint64_t x12;
  uint64_t uStack_68;
  fiat_p256_uint1 x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t uStack_50;
  fiat_p256_uint1 x8;
  uint64_t x7;
  uint64_t uStack_40;
  fiat_p256_uint1 x6;
  uint64_t x5;
  uint64_t uStack_30;
  fiat_p256_uint1 x4;
  uint64_t x3;
  uint64_t uStack_20;
  fiat_p256_uint1 x2;
  uint64_t x1;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  x1 = (uint64_t)arg1;
  arg1_local = out1;
  fiat_p256_subborrowx_u64(&stack0xffffffffffffffe0,(fiat_p256_uint1 *)((long)&x3 + 7),'\0',0,*arg1)
  ;
  fiat_p256_subborrowx_u64
            (&stack0xffffffffffffffd0,(fiat_p256_uint1 *)((long)&x5 + 7),x3._7_1_,0,
             *(uint64_t *)(x1 + 8));
  fiat_p256_subborrowx_u64
            (&stack0xffffffffffffffc0,(fiat_p256_uint1 *)((long)&x7 + 7),x5._7_1_,0,
             *(uint64_t *)(x1 + 0x10));
  fiat_p256_subborrowx_u64
            (&stack0xffffffffffffffb0,(fiat_p256_uint1 *)((long)&x9 + 7),x7._7_1_,0,
             *(uint64_t *)(x1 + 0x18));
  fiat_p256_cmovznz_u64(&x10,x9._7_1_,0,0xffffffffffffffff);
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffff98,(fiat_p256_uint1 *)((long)&x12 + 7),'\0',uStack_20,x10);
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffff88,(fiat_p256_uint1 *)((long)&x14 + 7),x12._7_1_,uStack_30,
             x10 & 0xffffffff);
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffff78,(fiat_p256_uint1 *)((long)&x16 + 7),x14._7_1_,uStack_40,0);
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffff68,&local_99,x16._7_1_,uStack_50,x10 & 0xffffffff00000001);
  *arg1_local = uStack_68;
  arg1_local[1] = uStack_78;
  arg1_local[2] = uStack_88;
  arg1_local[3] = uStack_98;
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_opp(fiat_p256_montgomery_domain_field_element out1, const fiat_p256_montgomery_domain_field_element arg1) {
  uint64_t x1;
  fiat_p256_uint1 x2;
  uint64_t x3;
  fiat_p256_uint1 x4;
  uint64_t x5;
  fiat_p256_uint1 x6;
  uint64_t x7;
  fiat_p256_uint1 x8;
  uint64_t x9;
  uint64_t x10;
  fiat_p256_uint1 x11;
  uint64_t x12;
  fiat_p256_uint1 x13;
  uint64_t x14;
  fiat_p256_uint1 x15;
  uint64_t x16;
  fiat_p256_uint1 x17;
  fiat_p256_subborrowx_u64(&x1, &x2, 0x0, 0x0, (arg1[0]));
  fiat_p256_subborrowx_u64(&x3, &x4, x2, 0x0, (arg1[1]));
  fiat_p256_subborrowx_u64(&x5, &x6, x4, 0x0, (arg1[2]));
  fiat_p256_subborrowx_u64(&x7, &x8, x6, 0x0, (arg1[3]));
  fiat_p256_cmovznz_u64(&x9, x8, 0x0, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x10, &x11, 0x0, x1, x9);
  fiat_p256_addcarryx_u64(&x12, &x13, x11, x3, (x9 & UINT32_C(0xffffffff)));
  fiat_p256_addcarryx_u64(&x14, &x15, x13, x5, 0x0);
  fiat_p256_addcarryx_u64(&x16, &x17, x15, x7, (x9 & UINT64_C(0xffffffff00000001)));
  out1[0] = x10;
  out1[1] = x12;
  out1[2] = x14;
  out1[3] = x16;
}